

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O0

void __thiscall jaegertracing::Span::Span(Span *this,Span *span)

{
  SpanContext local_118;
  lock_guard<std::mutex> local_40;
  lock_guard<std::mutex> spanLock;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> lock;
  Span *span_local;
  Span *this_local;
  
  opentracing::v3::Span::Span((Span *)this);
  *(code **)this = jaegertracing::metrics::Metrics::~Metrics;
  std::shared_ptr<const_jaegertracing::Tracer>::shared_ptr
            ((shared_ptr<const_jaegertracing::Tracer> *)(this + 8));
  SpanContext::SpanContext((SpanContext *)(this + 0x18));
  std::__cxx11::string::string((string *)(this + 0xe8));
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)(this + 0x108));
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)(this + 0x110));
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(this + 0x120));
  std::vector<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_>::vector
            ((vector<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_> *)
             (this + 0x138));
  std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::vector
            ((vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *)
             (this + 0x150));
  std::mutex::mutex((mutex *)(this + 0x168));
  std::lock<std::mutex,std::mutex>((mutex *)(this + 0x168),(mutex *)(span + 0x168));
  std::lock_guard<std::mutex>::lock_guard(&local_30,this + 0x168);
  std::lock_guard<std::mutex>::lock_guard(&local_40,span + 0x168);
  std::shared_ptr<const_jaegertracing::Tracer>::operator=
            ((shared_ptr<const_jaegertracing::Tracer> *)(this + 8),
             (shared_ptr<const_jaegertracing::Tracer> *)(span + 8));
  SpanContext::SpanContext(&local_118,(SpanContext *)(span + 0x18));
  SpanContext::operator=((SpanContext *)(this + 0x18),&local_118);
  SpanContext::~SpanContext(&local_118);
  std::__cxx11::string::operator=((string *)(this + 0xe8),(string *)(span + 0xe8));
  *(undefined8 *)(this + 0x108) = *(undefined8 *)(span + 0x108);
  *(undefined8 *)(this + 0x110) = *(undefined8 *)(span + 0x110);
  *(undefined8 *)(this + 0x118) = *(undefined8 *)(span + 0x118);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::operator=
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(this + 0x120),
             (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(span + 0x120));
  std::vector<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_>::operator=
            ((vector<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_> *)
             (this + 0x138),
             (vector<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_> *)
             (span + 0x138));
  std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::operator=
            ((vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *)
             (this + 0x150),
             (vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *)
             (span + 0x150));
  std::lock_guard<std::mutex>::~lock_guard(&local_40);
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  return;
}

Assistant:

Span(const Span& span)
    {
        std::lock(_mutex, span._mutex);
        std::lock_guard<std::mutex> lock(_mutex, std::adopt_lock);
        std::lock_guard<std::mutex> spanLock(span._mutex, std::adopt_lock);

        _tracer = span._tracer;
        _context = span._context;
        _operationName = span._operationName;
        _startTimeSystem = span._startTimeSystem;
        _startTimeSteady = span._startTimeSteady;
        _duration = span._duration;
        _tags = span._tags;
        _logs = span._logs;
        _references = span._references;
    }